

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_scan_mode_set(ll_scan_mode scan_mode)

{
  _Bool _Var1;
  int32_t local_18;
  int32_t ret;
  ll_scan_mode scan_mode_local;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    _ll_ifc_message_buff[0] = (uint8_t)scan_mode;
    local_18 = hal_read_write(OP_SCAN_MODE_SET,_ll_ifc_message_buff,1,(uint8_t *)0x0,0);
    transport_mutex_release();
    if (-1 < local_18) {
      local_18 = 0;
    }
    ret = local_18;
  }
  else {
    ret = -0x71;
  }
  return ret;
}

Assistant:

int32_t ll_scan_mode_set(enum ll_scan_mode scan_mode)
{

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    _ll_ifc_message_buff[0] = (uint8_t) scan_mode;

    int32_t ret = hal_read_write(OP_SCAN_MODE_SET, &_ll_ifc_message_buff[0], 1, NULL, 0);
    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}